

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O3

SubcaseBasePtr
deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedSwitchBuffersCS>(void)

{
  SubcaseBase *this;
  Functions *pFVar1;
  SharedPtrStateBase *extraout_RDX;
  SubcaseBase *in_RDI;
  SubcaseBasePtr SVar2;
  
  this = (SubcaseBase *)operator_new(0x48);
  (this->super_GLWrapper)._vptr_GLWrapper = (_func_int **)0x0;
  (this->super_GLWrapper).super_CallLogWrapper.m_gl = (Functions *)0x0;
  (this->super_GLWrapper).super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)&(this->super_GLWrapper).super_CallLogWrapper.m_enableLog = 0;
  (this->super_GLWrapper).m_context = (Context *)0x0;
  this[1].super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  this[1].super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  this[1].super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)&this[1].super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  SubcaseBase::SubcaseBase(this);
  (this->super_GLWrapper)._vptr_GLWrapper = (_func_int **)&PTR__SubcaseBase_020ffdc0;
  (in_RDI->super_GLWrapper).super_CallLogWrapper.m_gl = (Functions *)0x0;
  (in_RDI->super_GLWrapper)._vptr_GLWrapper = (_func_int **)this;
  pFVar1 = (Functions *)operator_new(0x20);
  *(undefined4 *)&pFVar1->activeTexture = 0;
  *(undefined4 *)((long)&pFVar1->activeTexture + 4) = 0;
  pFVar1->activeShaderProgram = (glActiveShaderProgramFunc)&PTR__SharedPtrState_020c83b0;
  pFVar1->attachShader = (glAttachShaderFunc)this;
  (in_RDI->super_GLWrapper).super_CallLogWrapper.m_gl = pFVar1;
  *(undefined4 *)&pFVar1->activeTexture = 1;
  *(undefined4 *)((long)&pFVar1->activeTexture + 4) = 1;
  SVar2.m_state = extraout_RDX;
  SVar2.m_ptr = in_RDI;
  return SVar2;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}